

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t psa_import_key_into_slot(psa_key_slot_t *slot,uint8_t *data,size_t data_length)

{
  mbedtls_mpi *X;
  ushort uVar1;
  undefined8 key;
  psa_key_bits_t pVar2;
  psa_status_t pVar3;
  int iVar4;
  mbedtls_pk_type_t mVar5;
  size_t sVar6;
  ushort uVar7;
  mbedtls_mpi n;
  mbedtls_pk_context mStack_58;
  mbedtls_mpi local_48;
  
  uVar1 = (slot->attr).type;
  uVar7 = uVar1 & 0x7000;
  if ((uVar7 == 0x2000) || (uVar7 == 0x1000)) {
    if (0xfff8 < data_length * 8 || data_length >> 0x3d != 0) {
      return -0x86;
    }
    pVar3 = prepare_raw_data_slot(uVar1,data_length * 8,&(slot->data).raw);
    if (pVar3 != 0) {
      return pVar3;
    }
    if (data_length != 0) {
      memcpy((slot->data).raw.data,data,data_length);
    }
  }
  else {
    if ((uVar1 & 0xff00) == 0x4100) {
      pVar3 = psa_import_ec_public_key((psa_ecc_curve_t)uVar1,data,data_length,&(slot->data).ecp);
    }
    else if ((uVar1 & 0xff00) == 0x7100) {
      local_48._0_8_ = (mbedtls_ecp_keypair *)0x0;
      pVar3 = psa_prepare_import_ec_key
                        ((psa_ecc_curve_t)uVar1,data_length,0,(mbedtls_ecp_keypair **)&local_48);
      key = local_48._0_8_;
      if (pVar3 == 0) {
        X = (mbedtls_mpi *)(local_48._0_8_ + 0xf8);
        iVar4 = mbedtls_mpi_read_binary(X,data,data_length);
        pVar3 = mbedtls_to_psa_error(iVar4);
        if (pVar3 == 0) {
          iVar4 = mbedtls_ecp_check_privkey((mbedtls_ecp_group *)key,X);
          pVar3 = mbedtls_to_psa_error(iVar4);
          if (pVar3 == 0) {
            iVar4 = mbedtls_ecp_mul((mbedtls_ecp_group *)key,(mbedtls_ecp_point *)(key + 0x110),X,
                                    &((mbedtls_ecp_group *)key)->G,mbedtls_ctr_drbg_random,
                                    &global_data.ctr_drbg);
            pVar3 = mbedtls_to_psa_error(iVar4);
            if (pVar3 == 0) {
              (slot->data).ecp = (mbedtls_ecp_keypair *)key;
LAB_0010e74e:
              pVar3 = 0;
              goto LAB_0010e6d0;
            }
          }
        }
      }
      if ((mbedtls_ecp_keypair *)key != (mbedtls_ecp_keypair *)0x0) {
        mbedtls_ecp_keypair_free((mbedtls_ecp_keypair *)key);
        free((void *)key);
      }
    }
    else {
      if ((uVar1 & 0xcfff) != 0x4001) {
        return -0x86;
      }
      mbedtls_pk_init(&mStack_58);
      if (uVar7 == 0x7000) {
        iVar4 = mbedtls_pk_parse_key(&mStack_58,data,data_length,(uchar *)0x0,0);
      }
      else {
        iVar4 = mbedtls_pk_parse_public_key(&mStack_58,data,data_length);
      }
      pVar3 = mbedtls_to_psa_error(iVar4);
      if (pVar3 == 0) {
        mVar5 = mbedtls_pk_get_type(&mStack_58);
        pVar3 = -0x87;
        if (mVar5 == MBEDTLS_PK_RSA) {
          sVar6 = mbedtls_rsa_get_len((mbedtls_rsa_context *)mStack_58.pk_ctx);
          pVar3 = -0x86;
          if (sVar6 * 8 < 0x1001) {
            mbedtls_mpi_init(&local_48);
            iVar4 = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_58.pk_ctx,&local_48,
                                       (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                       (mbedtls_mpi *)0x0);
            pVar3 = mbedtls_to_psa_error(iVar4);
            if (pVar3 == 0) {
              sVar6 = mbedtls_mpi_bitlen(&local_48);
              pVar3 = -0x86;
              if ((sVar6 & 7) == 0) {
                pVar3 = 0;
              }
            }
            mbedtls_mpi_free(&local_48);
            if (pVar3 == 0) {
              (slot->data).rsa = (mbedtls_rsa_context *)mStack_58.pk_ctx;
              goto LAB_0010e74e;
            }
          }
        }
      }
      mbedtls_pk_free(&mStack_58);
    }
LAB_0010e6d0:
    if (pVar3 != 0) {
      return pVar3;
    }
  }
  uVar1 = (slot->attr).type;
  if (((uVar1 & 0x7000) == 0x2000) || ((uVar1 & 0x7000) == 0x1000)) {
    sVar6 = (slot->data).raw.bytes;
  }
  else {
    if ((uVar1 & 0xcfff) != 0x4001) {
      if ((uVar1 & 0xcf00) == 0x4100) {
        pVar2 = (psa_key_bits_t)(((slot->data).rsa)->DQ).p;
      }
      else {
        pVar2 = 0;
      }
      goto LAB_0010e6f7;
    }
    sVar6 = mbedtls_rsa_get_len((slot->data).rsa);
  }
  pVar2 = (psa_key_bits_t)(sVar6 << 3);
LAB_0010e6f7:
  (slot->attr).bits = pVar2;
  return 0;
}

Assistant:

psa_status_t psa_import_key_into_slot( psa_key_slot_t *slot,
                                       const uint8_t *data,
                                       size_t data_length )
{
    psa_status_t status = PSA_SUCCESS;

    if( key_type_is_raw_bytes( slot->attr.type ) )
    {
        size_t bit_size = PSA_BYTES_TO_BITS( data_length );
        /* Ensure that the bytes-to-bit conversion didn't overflow. */
        if( data_length > SIZE_MAX / 8 )
            return( PSA_ERROR_NOT_SUPPORTED );
        /* Enforce a size limit, and in particular ensure that the bit
         * size fits in its representation type. */
        if( bit_size > PSA_MAX_KEY_BITS )
            return( PSA_ERROR_NOT_SUPPORTED );
        status = prepare_raw_data_slot( slot->attr.type, bit_size,
                                        &slot->data.raw );
        if( status != PSA_SUCCESS )
            return( status );
        if( data_length != 0 )
            memcpy( slot->data.raw.data, data, data_length );
    }
    else
#if defined(MBEDTLS_ECP_C)
    if( PSA_KEY_TYPE_IS_ECC_KEY_PAIR( slot->attr.type ) )
    {
        status = psa_import_ec_private_key( PSA_KEY_TYPE_GET_CURVE( slot->attr.type ),
                                            data, data_length,
                                            &slot->data.ecp );
    }
    else if( PSA_KEY_TYPE_IS_ECC_PUBLIC_KEY( slot->attr.type ) )
    {
        status = psa_import_ec_public_key(
            PSA_KEY_TYPE_GET_CURVE( slot->attr.type ),
            data, data_length,
            &slot->data.ecp );
    }
    else
#endif /* MBEDTLS_ECP_C */
#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_PK_PARSE_C)
    if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) )
    {
        status = psa_import_rsa_key( slot->attr.type,
            data, data_length,
            &slot->data.rsa );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) && defined(MBEDTLS_PK_PARSE_C) */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }

    if( status == PSA_SUCCESS )
    {
        /* Write the actual key size to the slot.
         * psa_start_key_creation() wrote the size declared by the
         * caller, which may be 0 (meaning unspecified) or wrong. */
        slot->attr.bits = psa_calculate_key_bits( slot );
    }
    return( status );
}